

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O2

void __thiscall FIR::highpass(FIR *this,int M,double f)

{
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  setTaps(this,M);
  std::vector<float,_std::allocator<float>_>::resize(&this->freq,1);
  if ((0.0 <= f) && (f <= 0.5)) {
    iVar3 = 0;
    setFreq(this,f,0);
    this->type = 'h';
    iVar1 = this->taps / 2;
    iVar2 = iVar1;
    if (iVar1 < 1) {
      iVar2 = -iVar1;
    }
    for (; iVar2 + iVar1 != iVar3; iVar3 = iVar3 + 1) {
      dVar4 = 1.0 - (f + f);
      i = iVar1;
      if (iVar1 != iVar3) {
        dVar5 = (double)(-iVar1 + iVar3);
        dVar4 = sin(f * 6.283185307179586 * dVar5);
        dVar4 = dVar4 / (dVar5 * -3.141592653589793);
        i = iVar3;
      }
      setCoeff(this,dVar4,i);
    }
    return;
  }
  puts("\nThe frequency is not normalized");
  return;
}

Assistant:

void FIR::highpass(int M,double f){

	this->setTaps(M);

	freq.resize(1);

	if (f<0.0 or f>0.5){printf("\nThe frequency is not normalized\n");}
	else{
		this->setFreq(f,0);
		this->setType('h');
		int M=this->getTaps();
		int W=M/2;

		for (int i=-W; i<W; i++){
			if (i==0) {
				this->setCoeff(1-(2*f),W);
			}else{		
				this->setCoeff(-sin(2*M_PI*f*i)/(i*M_PI),i+W);
			}
		}
	}
}